

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::TiledInputFile::TiledInputFile
          (TiledInputFile *this,Header *header,IStream *is,int version,int numThreads)

{
  int iVar1;
  Data *pDVar2;
  InputStreamMutex *pIVar3;
  undefined4 extraout_var;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__TiledInputFile_031e8158;
  pDVar2 = (Data *)operator_new(0x180);
  Data::Data(pDVar2,numThreads);
  this->_data = pDVar2;
  pDVar2->_deleteStream = false;
  pIVar3 = (InputStreamMutex *)operator_new(0x38);
  (pIVar3->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pIVar3->is = (IStream *)0x0;
  *(undefined8 *)((long)&(pIVar3->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (pIVar3->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pIVar3->super_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pIVar3->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
  pIVar3->currentPosition = 0;
  pDVar2->_streamData = pIVar3;
  pIVar3->is = is;
  Header::operator=(&pDVar2->header,header);
  this->_data->version = version;
  initialize(this);
  pDVar2 = this->_data;
  TileOffsets::readFrom
            (&pDVar2->tileOffsets,pDVar2->_streamData->is,&pDVar2->fileIsComplete,false,false);
  iVar1 = (*is->_vptr_IStream[2])(is);
  pDVar2 = this->_data;
  pDVar2->memoryMapped = SUB41(iVar1,0);
  iVar1 = (*pDVar2->_streamData->is->_vptr_IStream[5])();
  this->_data->_streamData->currentPosition = CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

TiledInputFile::TiledInputFile (const Header &header,
                                OPENEXR_IMF_INTERNAL_NAMESPACE::IStream *is,
                                int version,
                                int numThreads) :
    _data (new Data (numThreads))
{
    _data->_deleteStream=false;
    _data->_streamData = new InputStreamMutex();
    //
    // This constructor called by class Imf::InputFile
    // when a user wants to just read an image file, and
    // doesn't care or know if the file is tiled.
    // No need to have backward compatibility here, because
    // we have somehow got the header.
    //

    try
    {
        _data->_streamData->is = is;
        _data->header = header;
        _data->version = version;
        initialize();
        _data->tileOffsets.readFrom (*(_data->_streamData->is),_data->fileIsComplete,false,false);
        _data->memoryMapped = is->isMemoryMapped();
        _data->_streamData->currentPosition = _data->_streamData->is->tellg();
    }
    catch(...)
    {
        if (!_data->memoryMapped)
        {
            for (size_t i = 0; i < _data->tileBuffers.size(); i++)
            {
                if(_data->tileBuffers[i])
                {
                     delete [] _data->tileBuffers[i]->buffer;
                }
            }
        }
        delete _data->_streamData;
        delete _data;
        throw; 
    }
}